

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportAdditionalFrame
               (string *frame_name,Transform *link_H_frame,string *link_name,
               exportAdditionalFrameDirectionOption direction_option,xmlNodePtr parent_element)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  xmlNodePtr child_xml;
  xmlNodePtr parent_xml;
  string child_of_fake_joint;
  string parent_of_fake_joint;
  string fake_joint_name;
  xmlNodePtr joint_xml;
  xmlNodePtr link_xml;
  bool ok;
  string local_b0 [32];
  string local_90 [24];
  xmlNodePtr in_stack_ffffffffffffff88;
  Transform *in_stack_ffffffffffffff90;
  string local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  byte local_29;
  undefined8 local_28;
  int local_1c;
  
  local_29 = 1;
  local_28 = in_R8;
  local_1c = in_ECX;
  uVar2 = xmlNewChild(in_R8,0,"link");
  local_38 = uVar2;
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar2,"name",uVar3);
  local_40 = xmlNewChild(local_28,0,"joint");
  std::operator+(in_RDX,in_RSI);
  uVar2 = local_40;
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar2,"name",uVar3);
  xmlNewProp(local_40,"type","fixed");
  exportTransform(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::string(local_90);
  std::__cxx11::string::string(local_b0);
  if (local_1c == 0) {
    std::__cxx11::string::operator=(local_90,(string *)in_RDX);
    std::__cxx11::string::operator=(local_b0,in_RDI);
  }
  else {
    std::__cxx11::string::operator=(local_90,in_RDI);
    std::__cxx11::string::operator=(local_b0,(string *)in_RDX);
  }
  uVar2 = xmlNewChild(local_40,0,"parent");
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar2,"link",uVar3);
  uVar2 = xmlNewChild(local_40,0,"child");
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar2,"link",uVar3);
  bVar1 = local_29;
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool exportAdditionalFrame(const std::string frame_name, Transform link_H_frame, const std::string link_name, exportAdditionalFrameDirectionOption direction_option, xmlNodePtr parent_element)
{
    bool ok=true;

    // Export fake link
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST frame_name.c_str());

    // Export fake joint
    xmlNodePtr joint_xml = xmlNewChild(parent_element, NULL, BAD_CAST "joint", NULL);
    std::string fake_joint_name = frame_name + "_fixed_joint";
    xmlNewProp(joint_xml, BAD_CAST "name", BAD_CAST fake_joint_name.c_str());
    xmlNewProp(joint_xml, BAD_CAST "type", BAD_CAST "fixed");

    // origin
    exportTransform(link_H_frame, joint_xml);

    std::string parent_of_fake_joint, child_of_fake_joint;

    if (direction_option == FAKE_LINK_IS_CHILD) {
        parent_of_fake_joint = link_name;
        child_of_fake_joint = frame_name;
    } else {
        // direction_option == FAKE_LINK_IS_PARENT
        parent_of_fake_joint = frame_name;
        child_of_fake_joint = link_name;
    }

    // parent
    xmlNodePtr parent_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "parent", NULL);
    xmlNewProp(parent_xml, BAD_CAST "link", BAD_CAST parent_of_fake_joint.c_str());

    // child
    xmlNodePtr child_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "child", NULL);
    xmlNewProp(child_xml, BAD_CAST "link", BAD_CAST child_of_fake_joint.c_str());

    return ok;
}